

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.cc
# Opt level: O3

void detectDrawEyes(Mat *img,Mat *img_gray)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  __m128d t;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> eyes;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> faces;
  CascadeClassifier eyes_cascade;
  Mat faceROI;
  undefined8 *puVar9;
  undefined1 local_198 [8];
  undefined1 local_190 [16];
  undefined8 local_180;
  void *local_178;
  void *pvStack_170;
  long local_168;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> local_160;
  Mat *local_148;
  Mat *local_140;
  ulong local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  CascadeClassifier local_118 [16];
  undefined4 local_108 [2];
  Mat *local_100;
  undefined8 local_f8;
  long *local_f0 [2];
  long local_e0 [10];
  Mat local_90 [96];
  
  local_148 = img;
  local_140 = img_gray;
  cv::Mat::Mat(local_90,img_gray);
  detectFaces(&local_160,local_90);
  cv::Mat::~Mat(local_90);
  if (local_160.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_160.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      local_138 = uVar5;
      cv::Mat::Mat((Mat *)local_f0,local_140,
                   (Rect_ *)(local_160.
                             super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                             _M_impl.super__Vector_impl_data._M_start + uVar5));
      cv::CascadeClassifier::CascadeClassifier(local_118);
      local_198 = (undefined1  [8])(local_190 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_198,"/usr/local/share/opencv4/haarcascades/haarcascade_eye.xml","")
      ;
      cv::CascadeClassifier::load((string *)local_118);
      if (local_198 != (undefined1  [8])(local_190 + 8)) {
        operator_delete((void *)local_198,local_190._8_8_ + 1);
      }
      local_168 = 0;
      local_178 = (void *)0x0;
      pvStack_170 = (void *)0x0;
      local_198._0_4_ = 0x1010000;
      local_190._8_8_ = 0;
      local_190._0_8_ = (Mat *)local_f0;
      local_120 = 0x1e0000001e;
      local_128 = 0;
      puVar9 = &local_128;
      cv::CascadeClassifier::detectMultiScale
                (0x3ff199999999999a,local_118,(string *)local_198,&local_178,2,2,&local_120,puVar9);
      if (pvStack_170 != local_178) {
        lVar7 = 8;
        uVar6 = 0;
        do {
          uVar1 = local_160.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar5].x;
          uVar3 = local_160.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar5].y;
          iVar8 = (int)*(undefined8 *)((long)local_178 + lVar7);
          iVar4 = (int)((ulong)*(undefined8 *)((long)local_178 + lVar7) >> 0x20);
          uVar2 = *(undefined8 *)((long)local_178 + lVar7 + -8);
          local_130 = CONCAT44(iVar4 / 2 + (int)((ulong)uVar2 >> 0x20) + uVar3,
                               iVar8 / 2 + (int)uVar2 + uVar1);
          local_f8 = 0;
          local_108[0] = 0x3010000;
          local_100 = local_148;
          local_198 = (undefined1  [8])0x406fe00000000000;
          local_180 = 0;
          local_190 = (undefined1  [16])0x0;
          puVar9 = (undefined8 *)((ulong)puVar9 & 0xffffffff00000000);
          cv::circle(local_108,&local_130,(int)ROUND((double)(iVar4 + iVar8) * 0.25),
                     (string *)local_198,1,8,puVar9);
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + 0x10;
        } while (uVar6 < (ulong)((long)pvStack_170 - (long)local_178 >> 4));
      }
      uVar5 = local_138;
      if (local_178 != (void *)0x0) {
        operator_delete(local_178,local_168 - (long)local_178);
      }
      cv::CascadeClassifier::~CascadeClassifier(local_118);
      cv::Mat::~Mat((Mat *)local_f0);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)local_160.
                                   super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_160.
                                   super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"detect and draw eyes","");
  cv::namedWindow((string *)local_f0,1);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"detect and draw eyes","");
  local_198._0_4_ = 0x1010000;
  local_190._8_8_ = 0;
  local_190._0_8_ = local_148;
  cv::imshow((string *)local_f0,(_InputArray *)local_198);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  if (local_160.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_160.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void detectDrawEyes(Mat img, Mat img_gray) {
  vector<Rect> faces = detectFaces(img_gray);
  for (size_t i = 0; i < faces.size(); i++) {
    Mat faceROI = img_gray(faces[i]);
    CascadeClassifier eyes_cascade;
    eyes_cascade.load(
        "/usr/local/share/opencv4/haarcascades/haarcascade_eye.xml");
    vector<Rect> eyes;
    eyes_cascade.detectMultiScale(faceROI, eyes, 1.1, 2,
                                  0 | CASCADE_SCALE_IMAGE, Size(30, 30));
    for (size_t j = 0; j < eyes.size(); j++) {
      Point eyes_center(faces[i].x + eyes[j].x + eyes[j].width / 2,
                        faces[i].y + eyes[j].y + eyes[j].height / 2);
      int r = cvRound((eyes[j].width + eyes[j].height) * 0.25);
      circle(img, eyes_center, r, Scalar(255, 0, 0), 1, 8, 0);
    }
  }
  namedWindow("detect and draw eyes");
  imshow("detect and draw eyes", img);
}